

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSectionedSpine::~IfcSectionedSpine(IfcSectionedSpine *this)

{
  ~IfcSectionedSpine((IfcSectionedSpine *)&this[-1].field_0x70);
  return;
}

Assistant:

IfcSectionedSpine() : Object("IfcSectionedSpine") {}